

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::DecodeRawTransactionTxIn::ConvertFromStruct
          (DecodeRawTransactionTxIn *this,DecodeRawTransactionTxInStruct *data)

{
  DecodeRawTransactionTxInStruct *data_local;
  DecodeRawTransactionTxIn *this_local;
  
  std::__cxx11::string::operator=((string *)&this->coinbase_,(string *)data);
  std::__cxx11::string::operator=((string *)&this->txid_,(string *)&data->txid);
  this->vout_ = data->vout;
  DecodeUnlockingScript::ConvertFromStruct(&this->script_sig_,&data->script_sig);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertFromStruct(&this->txinwitness_,&data->txinwitness);
  this->sequence_ = data->sequence;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void DecodeRawTransactionTxIn::ConvertFromStruct(
    const DecodeRawTransactionTxInStruct& data) {
  coinbase_ = data.coinbase;
  txid_ = data.txid;
  vout_ = data.vout;
  script_sig_.ConvertFromStruct(data.script_sig);
  txinwitness_.ConvertFromStruct(data.txinwitness);
  sequence_ = data.sequence;
  ignore_items = data.ignore_items;
}